

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O1

string * __thiscall lest::transformed_abi_cxx11_(string *__return_storage_ptr__,lest *this,char chr)

{
  byte bVar1;
  long lVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_60;
  long local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_50;
  string local_40;
  
  bVar1 = (byte)this;
  lVar2 = 8;
  do {
    if (*(byte *)((long)&PTR_what_001b9c88 + lVar2) == bVar1) {
      std::__cxx11::string::string
                ((string *)&local_60,*(char **)(&DAT_001b9c90 + lVar2),(allocator *)&local_40);
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)__return_storage_ptr__,local_60,local_60->_M_local_buf + local_58);
      paVar3 = &local_50;
      goto LAB_0015d768;
    }
    lVar2 = lVar2 + 0x10;
  } while (lVar2 != 0x58);
  if (bVar1 < 0x20) {
    to_hex_string_abi_cxx11_(&local_40,(lest *)(ulong)(uint)(int)(char)bVar1,chr);
    local_60 = &local_50;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_60,local_40._M_dataplus._M_p,
               local_40._M_dataplus._M_p + local_40._M_string_length);
  }
  else {
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    std::__cxx11::string::_M_construct((ulong)&local_40,'\x01');
    local_60 = &local_50;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_60,local_40._M_dataplus._M_p,
               local_40._M_dataplus._M_p + local_40._M_string_length);
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,local_60,local_60->_M_local_buf + local_58);
  if (local_60 != &local_50) {
    operator_delete(local_60);
  }
  paVar3 = &local_40.field_2;
LAB_0015d768:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*(undefined1 **)(paVar3->_M_local_buf + -0x10) != paVar3) {
    operator_delete(*(undefined1 **)(paVar3->_M_local_buf + -0x10));
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::string transformed( char chr )
{
    struct Tr { char chr; char const * str; } table[] =
    {
        {'\\', "\\\\" },
        {'\r', "\\r"  }, {'\f', "\\f" },
        {'\n', "\\n"  }, {'\t', "\\t" },
    };

    for ( Tr * pos = table; pos != table + lest_DIMENSION_OF( table ); ++pos )
    {
        if ( chr == pos->chr )
            return pos->str;
    }

    return unprintable( chr  ) ? to_hex_string( chr ) : std::string( 1, chr );
}